

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
TasGrid::Optimizer::getGreedyNodes<(TasGrid::TypeOneDRule)17>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,int n)

{
  int iVar1;
  unsigned_long *puVar2;
  size_type sVar3;
  double local_80;
  int local_78;
  allocator<double> local_71;
  int i;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_68;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_60;
  undefined1 local_55;
  unsigned_long local_48;
  size_type local_40;
  unsigned_long local_38;
  size_t usefirst;
  vector<double,_std::allocator<double>_> precomputed;
  int n_local;
  vector<double,_std::allocator<double>_> *nodes;
  
  precomputed.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = n;
  getPrecomputed((vector<double,_std::allocator<double>_> *)&usefirst,rule_minlebesgue);
  local_40 = ::std::vector<double,_std::allocator<double>_>::size
                       ((vector<double,_std::allocator<double>_> *)&usefirst);
  local_48 = (unsigned_long)
             precomputed.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_;
  puVar2 = ::std::min<unsigned_long>(&local_40,&local_48);
  local_38 = *puVar2;
  local_55 = 0;
  local_60._M_current =
       (double *)
       ::std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)&usefirst);
  _i = ::std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)&usefirst);
  local_68 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )&i,local_38);
  ::std::allocator<double>::allocator(&local_71);
  ::std::vector<double,std::allocator<double>>::
  vector<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
            ((vector<double,std::allocator<double>> *)__return_storage_ptr__,local_60,local_68,
             &local_71);
  ::std::allocator<double>::~allocator(&local_71);
  iVar1 = precomputed.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_;
  sVar3 = ::std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)&usefirst);
  if ((int)sVar3 < iVar1) {
    ::std::vector<double,_std::allocator<double>_>::reserve
              (__return_storage_ptr__,
               (long)precomputed.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_);
    sVar3 = ::std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)&usefirst);
    for (local_78 = (int)sVar3;
        local_78 <
        precomputed.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_; local_78 = local_78 + 1) {
      local_80 = getNextNode<(TasGrid::TypeOneDRule)17>(__return_storage_ptr__);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)__return_storage_ptr__,&local_80);
    }
  }
  local_55 = 1;
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&usefirst);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> getGreedyNodes(int n){
    // load the first few precomputed nodes
    auto precomputed = getPrecomputed(rule);
    size_t usefirst = std::min(precomputed.size(), (size_t) n);
    std::vector<double> nodes(precomputed.begin(), precomputed.begin() + usefirst);
    if (n > (int) precomputed.size()){
        nodes.reserve((size_t) n);
        for(int i = (int) precomputed.size(); i<n; i++)
            nodes.push_back(getNextNode<rule>(nodes));
    }

    return nodes;
}